

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O3

void idct64_stage4_high32_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  __m128i alVar1;
  __m128i alVar2;
  int in_XMM0_Da;
  int in_XMM0_Db;
  int in_XMM0_Dc;
  int in_XMM0_Dd;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  __m128i alVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  __m128i alVar83;
  undefined1 auVar84 [16];
  __m128i alVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar5 [16];
  undefined1 auVar10 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar25 [16];
  undefined1 auVar6 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar26 [16];
  undefined1 auVar7 [16];
  undefined1 auVar12 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [16];
  undefined1 auVar27 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  
  alVar75 = x[0x21];
  alVar85 = x[0x22];
  alVar1 = x[0x25];
  alVar2 = x[0x26];
  auVar72._0_12_ = alVar75._0_12_;
  auVar72._12_2_ = alVar75[0]._6_2_;
  auVar72._14_2_ = *(undefined2 *)((long)x[0x3e] + 6);
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = alVar75._0_10_;
  auVar71._10_2_ = *(undefined2 *)((long)x[0x3e] + 4);
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._0_8_ = alVar75[0];
  auVar70._8_2_ = alVar75[0]._4_2_;
  auVar69._8_8_ = auVar70._8_8_;
  auVar69._6_2_ = *(undefined2 *)((long)x[0x3e] + 2);
  auVar69._4_2_ = alVar75[0]._2_2_;
  auVar69._0_2_ = (undefined2)alVar75[0];
  auVar69._2_2_ = (short)x[0x3e][0];
  auVar54._2_2_ = (short)x[0x3e][1];
  auVar54._0_2_ = (short)alVar75[1];
  auVar54._4_2_ = alVar75[1]._2_2_;
  auVar54._6_2_ = *(undefined2 *)((long)x[0x3e] + 10);
  auVar54._8_2_ = alVar75[1]._4_2_;
  auVar54._10_2_ = *(undefined2 *)((long)x[0x3e] + 0xc);
  auVar54._12_2_ = alVar75[1]._6_2_;
  auVar54._14_2_ = *(undefined2 *)((long)x[0x3e] + 0xe);
  auVar40._8_4_ = 0x191f014;
  auVar40._0_8_ = 0x191f0140191f014;
  auVar40._12_4_ = 0x191f014;
  auVar81 = pmaddwd(auVar69,auVar40);
  auVar87 = pmaddwd(auVar54,auVar40);
  auVar89._8_4_ = 0xfec0191;
  auVar89._0_8_ = 0xfec01910fec0191;
  auVar89._12_4_ = 0xfec0191;
  auVar73 = pmaddwd(auVar69,auVar89);
  auVar55 = pmaddwd(auVar54,auVar89);
  auVar82._0_4_ = auVar81._0_4_ + in_XMM0_Da >> 0xc;
  auVar82._4_4_ = auVar81._4_4_ + in_XMM0_Db >> 0xc;
  auVar82._8_4_ = auVar81._8_4_ + in_XMM0_Dc >> 0xc;
  auVar82._12_4_ = auVar81._12_4_ + in_XMM0_Dd >> 0xc;
  auVar88._0_4_ = auVar87._0_4_ + in_XMM0_Da >> 0xc;
  auVar88._4_4_ = auVar87._4_4_ + in_XMM0_Db >> 0xc;
  auVar88._8_4_ = auVar87._8_4_ + in_XMM0_Dc >> 0xc;
  auVar88._12_4_ = auVar87._12_4_ + in_XMM0_Dd >> 0xc;
  alVar83 = (__m128i)packssdw(auVar82,auVar88);
  auVar74._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar74._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar74._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar74._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  auVar56._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar56._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar56._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar56._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar74,auVar56);
  x[0x21] = alVar83;
  x[0x3e] = alVar75;
  auVar60._0_12_ = alVar85._0_12_;
  auVar60._12_2_ = alVar85[0]._6_2_;
  auVar60._14_2_ = *(undefined2 *)((long)x[0x3d] + 6);
  auVar59._12_4_ = auVar60._12_4_;
  auVar59._0_10_ = alVar85._0_10_;
  auVar59._10_2_ = *(undefined2 *)((long)x[0x3d] + 4);
  auVar58._10_6_ = auVar59._10_6_;
  auVar58._0_8_ = alVar85[0];
  auVar58._8_2_ = alVar85[0]._4_2_;
  auVar57._8_8_ = auVar58._8_8_;
  auVar57._6_2_ = *(undefined2 *)((long)x[0x3d] + 2);
  auVar57._4_2_ = alVar85[0]._2_2_;
  auVar57._0_2_ = (undefined2)alVar85[0];
  auVar57._2_2_ = (short)x[0x3d][0];
  auVar29._2_2_ = (short)x[0x3d][1];
  auVar29._0_2_ = (short)alVar85[1];
  auVar29._4_2_ = alVar85[1]._2_2_;
  auVar29._6_2_ = *(undefined2 *)((long)x[0x3d] + 10);
  auVar29._8_2_ = alVar85[1]._4_2_;
  auVar29._10_2_ = *(undefined2 *)((long)x[0x3d] + 0xc);
  auVar29._12_2_ = alVar85[1]._6_2_;
  auVar29._14_2_ = *(undefined2 *)((long)x[0x3d] + 0xe);
  auVar76._8_4_ = 0xf014fe6f;
  auVar76._0_8_ = 0xf014fe6ff014fe6f;
  auVar76._12_4_ = 0xf014fe6f;
  auVar87 = pmaddwd(auVar57,auVar76);
  auVar81 = pmaddwd(auVar76,auVar29);
  auVar73 = pmaddwd(auVar57,auVar40);
  auVar55 = pmaddwd(auVar29,auVar40);
  auVar84._0_4_ = auVar87._0_4_ + in_XMM0_Da >> 0xc;
  auVar84._4_4_ = auVar87._4_4_ + in_XMM0_Db >> 0xc;
  auVar84._8_4_ = auVar87._8_4_ + in_XMM0_Dc >> 0xc;
  auVar84._12_4_ = auVar87._12_4_ + in_XMM0_Dd >> 0xc;
  auVar77._0_4_ = auVar81._0_4_ + in_XMM0_Da >> 0xc;
  auVar77._4_4_ = auVar81._4_4_ + in_XMM0_Db >> 0xc;
  auVar77._8_4_ = auVar81._8_4_ + in_XMM0_Dc >> 0xc;
  auVar77._12_4_ = auVar81._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar84,auVar77);
  auVar61._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar61._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar61._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar61._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  auVar30._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar30._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar30._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar30._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar61,auVar30);
  x[0x22] = alVar85;
  x[0x3d] = alVar75;
  auVar44._0_12_ = alVar1._0_12_;
  auVar44._12_2_ = alVar1[0]._6_2_;
  auVar44._14_2_ = *(undefined2 *)((long)x[0x3a] + 6);
  auVar43._12_4_ = auVar44._12_4_;
  auVar43._0_10_ = alVar1._0_10_;
  auVar43._10_2_ = *(undefined2 *)((long)x[0x3a] + 4);
  auVar42._10_6_ = auVar43._10_6_;
  auVar42._0_8_ = alVar1[0];
  auVar42._8_2_ = alVar1[0]._4_2_;
  auVar41._8_8_ = auVar42._8_8_;
  auVar41._6_2_ = *(undefined2 *)((long)x[0x3a] + 2);
  auVar41._4_2_ = alVar1[0]._2_2_;
  auVar41._0_2_ = (undefined2)alVar1[0];
  auVar41._2_2_ = (short)x[0x3a][0];
  auVar64._2_2_ = (short)x[0x3a][1];
  auVar64._0_2_ = (short)alVar1[1];
  auVar64._4_2_ = alVar1[1]._2_2_;
  auVar64._6_2_ = *(undefined2 *)((long)x[0x3a] + 10);
  auVar64._8_2_ = alVar1[1]._4_2_;
  auVar64._10_2_ = *(undefined2 *)((long)x[0x3a] + 0xc);
  auVar64._12_2_ = alVar1[1]._6_2_;
  auVar64._14_2_ = *(undefined2 *)((long)x[0x3a] + 0xe);
  auVar31._8_4_ = 0xc5ef5da;
  auVar31._0_8_ = 0xc5ef5da0c5ef5da;
  auVar31._12_4_ = 0xc5ef5da;
  auVar81 = pmaddwd(auVar41,auVar31);
  auVar87 = pmaddwd(auVar64,auVar31);
  auVar86._8_4_ = 0xa260c5e;
  auVar86._0_8_ = 0xa260c5e0a260c5e;
  auVar86._12_4_ = 0xa260c5e;
  auVar73 = pmaddwd(auVar41,auVar86);
  auVar55 = pmaddwd(auVar64,auVar86);
  auVar62._0_4_ = auVar81._0_4_ + in_XMM0_Da >> 0xc;
  auVar62._4_4_ = auVar81._4_4_ + in_XMM0_Db >> 0xc;
  auVar62._8_4_ = auVar81._8_4_ + in_XMM0_Dc >> 0xc;
  auVar62._12_4_ = auVar81._12_4_ + in_XMM0_Dd >> 0xc;
  auVar78._0_4_ = auVar87._0_4_ + in_XMM0_Da >> 0xc;
  auVar78._4_4_ = auVar87._4_4_ + in_XMM0_Db >> 0xc;
  auVar78._8_4_ = auVar87._8_4_ + in_XMM0_Dc >> 0xc;
  auVar78._12_4_ = auVar87._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar62,auVar78);
  auVar45._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar45._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar45._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar45._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  auVar3._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar3._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar3._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar3._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar45,auVar3);
  x[0x25] = alVar85;
  x[0x3a] = alVar75;
  auVar7._0_12_ = alVar2._0_12_;
  auVar7._12_2_ = alVar2[0]._6_2_;
  auVar7._14_2_ = *(undefined2 *)((long)x[0x39] + 6);
  auVar6._12_4_ = auVar7._12_4_;
  auVar6._0_10_ = alVar2._0_10_;
  auVar6._10_2_ = *(undefined2 *)((long)x[0x39] + 4);
  auVar5._10_6_ = auVar6._10_6_;
  auVar5._0_8_ = alVar2[0];
  auVar5._8_2_ = alVar2[0]._4_2_;
  auVar4._8_8_ = auVar5._8_8_;
  auVar4._6_2_ = *(undefined2 *)((long)x[0x39] + 2);
  auVar4._4_2_ = alVar2[0]._2_2_;
  auVar4._0_2_ = (undefined2)alVar2[0];
  auVar4._2_2_ = (short)x[0x39][0];
  auVar55._2_2_ = (short)x[0x39][1];
  auVar55._0_2_ = (short)alVar2[1];
  auVar55._4_2_ = alVar2[1]._2_2_;
  auVar55._6_2_ = *(undefined2 *)((long)x[0x39] + 10);
  auVar55._8_2_ = alVar2[1]._4_2_;
  auVar55._10_2_ = *(undefined2 *)((long)x[0x39] + 0xc);
  auVar55._12_2_ = alVar2[1]._6_2_;
  auVar55._14_2_ = *(undefined2 *)((long)x[0x39] + 0xe);
  auVar46._8_4_ = 0xf5daf3a2;
  auVar46._0_8_ = 0xf5daf3a2f5daf3a2;
  auVar46._12_4_ = 0xf5daf3a2;
  auVar87 = pmaddwd(auVar4,auVar46);
  auVar81 = pmaddwd(auVar46,auVar55);
  auVar73 = pmaddwd(auVar4,auVar31);
  auVar55 = pmaddwd(auVar55,auVar31);
  auVar63._0_4_ = auVar87._0_4_ + in_XMM0_Da >> 0xc;
  auVar63._4_4_ = auVar87._4_4_ + in_XMM0_Db >> 0xc;
  auVar63._8_4_ = auVar87._8_4_ + in_XMM0_Dc >> 0xc;
  auVar63._12_4_ = auVar87._12_4_ + in_XMM0_Dd >> 0xc;
  auVar47._0_4_ = auVar81._0_4_ + in_XMM0_Da >> 0xc;
  auVar47._4_4_ = auVar81._4_4_ + in_XMM0_Db >> 0xc;
  auVar47._8_4_ = auVar81._8_4_ + in_XMM0_Dc >> 0xc;
  auVar47._12_4_ = auVar81._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar63,auVar47);
  auVar8._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar8._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar8._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar8._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  auVar73._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar73._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar73._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar73._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar8,auVar73);
  x[0x26] = alVar85;
  x[0x39] = alVar75;
  alVar75 = x[0x29];
  auVar12._0_12_ = alVar75._0_12_;
  auVar12._12_2_ = alVar75[0]._6_2_;
  auVar12._14_2_ = *(undefined2 *)((long)x[0x36] + 6);
  auVar11._12_4_ = auVar12._12_4_;
  auVar11._0_10_ = alVar75._0_10_;
  auVar11._10_2_ = *(undefined2 *)((long)x[0x36] + 4);
  auVar10._10_6_ = auVar11._10_6_;
  auVar10._0_8_ = alVar75[0];
  auVar10._8_2_ = alVar75[0]._4_2_;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._6_2_ = *(undefined2 *)((long)x[0x36] + 2);
  auVar9._4_2_ = alVar75[0]._2_2_;
  auVar9._0_2_ = (undefined2)alVar75[0];
  auVar9._2_2_ = (short)x[0x36][0];
  auVar32._2_2_ = (short)x[0x36][1];
  auVar32._0_2_ = (short)alVar75[1];
  auVar32._4_2_ = alVar75[1]._2_2_;
  auVar32._6_2_ = *(undefined2 *)((long)x[0x36] + 10);
  auVar32._8_2_ = alVar75[1]._4_2_;
  auVar32._10_2_ = *(undefined2 *)((long)x[0x36] + 0xc);
  auVar32._12_2_ = alVar75[1]._6_2_;
  auVar32._14_2_ = *(undefined2 *)((long)x[0x36] + 0xe);
  auVar81._8_4_ = 0x78bf1e4;
  auVar81._0_8_ = 0x78bf1e4078bf1e4;
  auVar81._12_4_ = 0x78bf1e4;
  auVar87 = pmaddwd(auVar9,auVar81);
  auVar64 = pmaddwd(auVar32,auVar81);
  auVar79._8_4_ = 0xe1c078b;
  auVar79._0_8_ = 0xe1c078b0e1c078b;
  auVar79._12_4_ = 0xe1c078b;
  auVar55 = pmaddwd(auVar9,auVar79);
  auVar73 = pmaddwd(auVar32,auVar79);
  auVar48._0_4_ = auVar87._0_4_ + in_XMM0_Da >> 0xc;
  auVar48._4_4_ = auVar87._4_4_ + in_XMM0_Db >> 0xc;
  auVar48._8_4_ = auVar87._8_4_ + in_XMM0_Dc >> 0xc;
  auVar48._12_4_ = auVar87._12_4_ + in_XMM0_Dd >> 0xc;
  auVar65._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar65._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar65._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar65._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar48,auVar65);
  auVar13._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar13._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar13._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar13._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  auVar33._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar33._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar33._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar33._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar13,auVar33);
  x[0x29] = alVar85;
  x[0x36] = alVar75;
  alVar75 = x[0x2a];
  auVar17._0_12_ = alVar75._0_12_;
  auVar17._12_2_ = alVar75[0]._6_2_;
  auVar17._14_2_ = *(undefined2 *)((long)x[0x35] + 6);
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_10_ = alVar75._0_10_;
  auVar16._10_2_ = *(undefined2 *)((long)x[0x35] + 4);
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._0_8_ = alVar75[0];
  auVar15._8_2_ = alVar75[0]._4_2_;
  auVar14._8_8_ = auVar15._8_8_;
  auVar14._6_2_ = *(undefined2 *)((long)x[0x35] + 2);
  auVar14._4_2_ = alVar75[0]._2_2_;
  auVar14._0_2_ = (undefined2)alVar75[0];
  auVar14._2_2_ = (short)x[0x35][0];
  auVar34._2_2_ = (short)x[0x35][1];
  auVar34._0_2_ = (short)alVar75[1];
  auVar34._4_2_ = alVar75[1]._2_2_;
  auVar34._6_2_ = *(undefined2 *)((long)x[0x35] + 10);
  auVar34._8_2_ = alVar75[1]._4_2_;
  auVar34._10_2_ = *(undefined2 *)((long)x[0x35] + 0xc);
  auVar34._12_2_ = alVar75[1]._6_2_;
  auVar34._14_2_ = *(undefined2 *)((long)x[0x35] + 0xe);
  auVar49._8_4_ = 0xf1e4f875;
  auVar49._0_8_ = 0xf1e4f875f1e4f875;
  auVar49._12_4_ = 0xf1e4f875;
  auVar64 = pmaddwd(auVar14,auVar49);
  auVar87 = pmaddwd(auVar49,auVar34);
  auVar55 = pmaddwd(auVar14,auVar81);
  auVar73 = pmaddwd(auVar34,auVar81);
  auVar66._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar66._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar66._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar66._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar50._0_4_ = auVar87._0_4_ + in_XMM0_Da >> 0xc;
  auVar50._4_4_ = auVar87._4_4_ + in_XMM0_Db >> 0xc;
  auVar50._8_4_ = auVar87._8_4_ + in_XMM0_Dc >> 0xc;
  auVar50._12_4_ = auVar87._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar66,auVar50);
  auVar18._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar18._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar18._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar18._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  auVar35._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar35._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar35._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar35._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar18,auVar35);
  x[0x2a] = alVar85;
  x[0x35] = alVar75;
  alVar75 = x[0x2d];
  auVar22._0_12_ = alVar75._0_12_;
  auVar22._12_2_ = alVar75[0]._6_2_;
  auVar22._14_2_ = *(undefined2 *)((long)x[0x32] + 6);
  auVar21._12_4_ = auVar22._12_4_;
  auVar21._0_10_ = alVar75._0_10_;
  auVar21._10_2_ = *(undefined2 *)((long)x[0x32] + 4);
  auVar20._10_6_ = auVar21._10_6_;
  auVar20._0_8_ = alVar75[0];
  auVar20._8_2_ = alVar75[0]._4_2_;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._6_2_ = *(undefined2 *)((long)x[0x32] + 2);
  auVar19._4_2_ = alVar75[0]._2_2_;
  auVar19._0_2_ = (undefined2)alVar75[0];
  auVar19._2_2_ = (short)x[0x32][0];
  auVar36._2_2_ = (short)x[0x32][1];
  auVar36._0_2_ = (short)alVar75[1];
  auVar36._4_2_ = alVar75[1]._2_2_;
  auVar36._6_2_ = *(undefined2 *)((long)x[0x32] + 10);
  auVar36._8_2_ = alVar75[1]._4_2_;
  auVar36._10_2_ = *(undefined2 *)((long)x[0x32] + 0xc);
  auVar36._12_2_ = alVar75[1]._6_2_;
  auVar36._14_2_ = *(undefined2 *)((long)x[0x32] + 0xe);
  auVar87._8_4_ = 0xf50fb5b;
  auVar87._0_8_ = 0xf50fb5b0f50fb5b;
  auVar87._12_4_ = 0xf50fb5b;
  auVar81 = pmaddwd(auVar19,auVar87);
  auVar64 = pmaddwd(auVar36,auVar87);
  auVar80._8_4_ = 0x4a50f50;
  auVar80._0_8_ = 0x4a50f5004a50f50;
  auVar80._12_4_ = 0x4a50f50;
  auVar55 = pmaddwd(auVar19,auVar80);
  auVar73 = pmaddwd(auVar36,auVar80);
  auVar51._0_4_ = auVar81._0_4_ + in_XMM0_Da >> 0xc;
  auVar51._4_4_ = auVar81._4_4_ + in_XMM0_Db >> 0xc;
  auVar51._8_4_ = auVar81._8_4_ + in_XMM0_Dc >> 0xc;
  auVar51._12_4_ = auVar81._12_4_ + in_XMM0_Dd >> 0xc;
  auVar67._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar67._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar67._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar67._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar51,auVar67);
  auVar23._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar23._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar23._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar23._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  auVar37._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar37._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar37._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar37._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar23,auVar37);
  x[0x2d] = alVar85;
  x[0x32] = alVar75;
  alVar75 = x[0x2e];
  auVar27._0_12_ = alVar75._0_12_;
  auVar27._12_2_ = alVar75[0]._6_2_;
  auVar27._14_2_ = *(undefined2 *)((long)x[0x31] + 6);
  auVar26._12_4_ = auVar27._12_4_;
  auVar26._0_10_ = alVar75._0_10_;
  auVar26._10_2_ = *(undefined2 *)((long)x[0x31] + 4);
  auVar25._10_6_ = auVar26._10_6_;
  auVar25._0_8_ = alVar75[0];
  auVar25._8_2_ = alVar75[0]._4_2_;
  auVar24._8_8_ = auVar25._8_8_;
  auVar24._6_2_ = *(undefined2 *)((long)x[0x31] + 2);
  auVar24._4_2_ = alVar75[0]._2_2_;
  auVar24._0_2_ = (undefined2)alVar75[0];
  auVar24._2_2_ = (short)x[0x31][0];
  auVar38._2_2_ = (short)x[0x31][1];
  auVar38._0_2_ = (short)alVar75[1];
  auVar38._4_2_ = alVar75[1]._2_2_;
  auVar38._6_2_ = *(undefined2 *)((long)x[0x31] + 10);
  auVar38._8_2_ = alVar75[1]._4_2_;
  auVar38._10_2_ = *(undefined2 *)((long)x[0x31] + 0xc);
  auVar38._12_2_ = alVar75[1]._6_2_;
  auVar38._14_2_ = *(undefined2 *)((long)x[0x31] + 0xe);
  auVar52._8_4_ = 0xfb5bf0b0;
  auVar52._0_8_ = 0xfb5bf0b0fb5bf0b0;
  auVar52._12_4_ = 0xfb5bf0b0;
  auVar64 = pmaddwd(auVar24,auVar52);
  auVar81 = pmaddwd(auVar52,auVar38);
  auVar55 = pmaddwd(auVar24,auVar87);
  auVar73 = pmaddwd(auVar38,auVar87);
  auVar68._0_4_ = auVar64._0_4_ + in_XMM0_Da >> 0xc;
  auVar68._4_4_ = auVar64._4_4_ + in_XMM0_Db >> 0xc;
  auVar68._8_4_ = auVar64._8_4_ + in_XMM0_Dc >> 0xc;
  auVar68._12_4_ = auVar64._12_4_ + in_XMM0_Dd >> 0xc;
  auVar53._0_4_ = auVar81._0_4_ + in_XMM0_Da >> 0xc;
  auVar53._4_4_ = auVar81._4_4_ + in_XMM0_Db >> 0xc;
  auVar53._8_4_ = auVar81._8_4_ + in_XMM0_Dc >> 0xc;
  auVar53._12_4_ = auVar81._12_4_ + in_XMM0_Dd >> 0xc;
  alVar85 = (__m128i)packssdw(auVar68,auVar53);
  auVar28._0_4_ = auVar55._0_4_ + in_XMM0_Da >> 0xc;
  auVar28._4_4_ = auVar55._4_4_ + in_XMM0_Db >> 0xc;
  auVar28._8_4_ = auVar55._8_4_ + in_XMM0_Dc >> 0xc;
  auVar28._12_4_ = auVar55._12_4_ + in_XMM0_Dd >> 0xc;
  auVar39._0_4_ = auVar73._0_4_ + in_XMM0_Da >> 0xc;
  auVar39._4_4_ = auVar73._4_4_ + in_XMM0_Db >> 0xc;
  auVar39._8_4_ = auVar73._8_4_ + in_XMM0_Dc >> 0xc;
  auVar39._12_4_ = auVar73._12_4_ + in_XMM0_Dd >> 0xc;
  alVar75 = (__m128i)packssdw(auVar28,auVar39);
  x[0x2e] = alVar85;
  x[0x31] = alVar75;
  return;
}

Assistant:

static inline void idct64_stage4_high32_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  const __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  const __m128i cospi_m60_m04 = pair_set_epi16(-cospi[60], -cospi[4]);
  const __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  const __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  const __m128i cospi_m28_m36 = pair_set_epi16(-cospi[28], -cospi[36]);
  const __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  const __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  const __m128i cospi_m44_m20 = pair_set_epi16(-cospi[44], -cospi[20]);
  const __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);
  const __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  const __m128i cospi_m12_m52 = pair_set_epi16(-cospi[12], -cospi[52]);
  btf_16_sse2(cospi_m04_p60, cospi_p60_p04, x[33], x[62], x[33], x[62]);
  btf_16_sse2(cospi_m60_m04, cospi_m04_p60, x[34], x[61], x[34], x[61]);
  btf_16_sse2(cospi_m36_p28, cospi_p28_p36, x[37], x[58], x[37], x[58]);
  btf_16_sse2(cospi_m28_m36, cospi_m36_p28, x[38], x[57], x[38], x[57]);
  btf_16_sse2(cospi_m20_p44, cospi_p44_p20, x[41], x[54], x[41], x[54]);
  btf_16_sse2(cospi_m44_m20, cospi_m20_p44, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m52_p12, cospi_p12_p52, x[45], x[50], x[45], x[50]);
  btf_16_sse2(cospi_m12_m52, cospi_m52_p12, x[46], x[49], x[46], x[49]);
}